

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

int LiteScript::Syntax::ReadReturn
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  bool bVar1;
  uint uVar2;
  ErrorType *in_RCX;
  int iVar3;
  Instruction local_60;
  string keyword;
  
  keyword._M_dataplus._M_p = (pointer)&keyword.field_2;
  keyword._M_string_length = 0;
  keyword.field_2._M_local_buf[0] = '\0';
  uVar2 = ReadName(text,&keyword);
  iVar3 = 0;
  if (uVar2 != 0) {
    bVar1 = std::operator!=(&keyword,"return");
    iVar3 = 0;
    if (!bVar1) {
      uVar2 = ReadWhitespace(text + 6);
      if (text[(long)(int)uVar2 + 6] == ';') {
        Instruction::Instruction(&local_60,INSTR_RETURN);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>(instrl,&local_60);
        Instruction::~Instruction(&local_60);
        iVar3 = uVar2 + 7;
      }
      else {
        iVar3 = ReadExpression((Syntax *)(text + (long)(int)uVar2 + 6),(char *)instrl,
                               (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                *)errorType,in_RCX);
        if (iVar3 < 1) {
          if (iVar3 == 0) {
            *errorType = SCRPT_ERROR_RETURN;
            iVar3 = -6 - uVar2;
          }
          else {
            iVar3 = iVar3 - (uVar2 + 6);
          }
        }
        else {
          iVar3 = iVar3 + uVar2 + 6;
          uVar2 = ReadWhitespace(text + iVar3);
          Instruction::Instruction(&local_60,INSTR_DEFINE_RETURN);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
          emplace_back<LiteScript::Instruction>(instrl,&local_60);
          Instruction::~Instruction(&local_60);
          Instruction::Instruction(&local_60,INSTR_RETURN);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
          emplace_back<LiteScript::Instruction>(instrl,&local_60);
          iVar3 = uVar2 + iVar3;
          Instruction::~Instruction(&local_60);
          if (text[iVar3] == ';') {
            iVar3 = iVar3 + 1;
          }
          else {
            *errorType = SCRPT_ERROR_SEMICOLON;
            iVar3 = -iVar3;
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&keyword);
  return iVar3;
}

Assistant:

int LiteScript::Syntax::ReadReturn(const char *text, std::vector<Instruction> &instrl, Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "return")
        return 0;
    int i = 6;
    i += (int)ReadWhitespace(text + i);
    if (text[i] == ';') {
        instrl.push_back(Instruction(InstrCode::INSTR_RETURN));
        return i + 1;
    }
    int tmp;
    if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_RETURN;
            return -i;
        }
    }
    i += tmp;
    i += (int)ReadWhitespace(text + i);
    instrl.push_back(Instruction(InstrCode::INSTR_DEFINE_RETURN));
    instrl.push_back(Instruction(InstrCode::INSTR_RETURN));
    if (text[i] != ';') {
        errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
        return -i;
    }
    return i + 1;
}